

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  ParseContext *extraout_RDX;
  ParseContext *ctx_00;
  RepeatedField<unsigned_int> *this;
  char *pcVar8;
  char *pcVar9;
  uint *puVar10;
  int iVar11;
  uint uVar12;
  char *unaff_R14;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar13;
  int local_40;
  
  puVar10 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar10 & 3) != 0) {
LAB_002a0314:
    AlignFail();
  }
  this = (RepeatedField<unsigned_int> *)((long)&msg->_vptr_MessageLite + (ulong)*puVar10);
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  aVar7.data = (long)&table->has_bits_offset + (ulong)table->aux_offset;
  uVar3 = *(uint *)(aVar7.data + (ulong)(ushort)puVar10[2] * 8);
  iVar11 = (int)(short)uVar3;
  ctx_00 = ctx;
  do {
    pcVar8 = (char *)(long)*ptr;
    if ((long)pcVar8 < 0) {
      uVar6 = (long)(char)((byte *)ptr)[1] << 7 | 0x7f;
      if ((long)uVar6 < 0) {
        aVar7.data = (long)(char)((byte *)ptr)[2] << 0xe | 0x3fff;
        if ((long)aVar7 < 0) {
          ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[3] << 0x15 | 0x1fffff);
          uVar6 = uVar6 & (ulong)ctx_00;
          if ((long)uVar6 < 0) {
            ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[4] << 0x1c | 0xfffffff);
            aVar7.data = aVar7.data & (ulong)ctx_00;
            if ((long)aVar7.data < 0) {
              ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[5] << 0x23 | 0x7ffffffff);
              uVar6 = uVar6 & (ulong)ctx_00;
              if ((long)uVar6 < 0) {
                ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[6] << 0x2a | 0x3ffffffffff);
                aVar7.data = aVar7.data & (ulong)ctx_00;
                if ((long)aVar7 < 0) {
                  ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[7] << 0x31 | 0x1ffffffffffff);
                  uVar6 = uVar6 & (ulong)ctx_00;
                  if ((long)uVar6 < 0) {
                    ctx_00 = (ParseContext *)((ulong)((byte *)ptr)[8] << 0x38 | 0xffffffffffffff);
                    aVar7.data = aVar7.data & (ulong)ctx_00;
                    if ((long)aVar7 < 0) {
                      p = (byte *)ptr + 10;
                      if (((byte *)ptr)[9] != 1) {
                        bVar1 = ((byte *)ptr)[9];
                        ctx_00 = (ParseContext *)CONCAT71((int7)((ulong)ctx_00 >> 8),bVar1);
                        if ((char)bVar1 < '\0') {
                          p = (byte *)0x0;
                          goto LAB_002a0108;
                        }
                        if ((bVar1 & 1) == 0) {
                          aVar7.data = aVar7.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      p = (byte *)ptr + 9;
                    }
                  }
                  else {
                    p = (byte *)ptr + 8;
                  }
                }
                else {
                  p = (byte *)ptr + 7;
                }
              }
              else {
                p = (byte *)ptr + 6;
              }
            }
            else {
              p = (byte *)ptr + 5;
            }
          }
          else {
            p = (byte *)ptr + 4;
          }
        }
        else {
          p = (byte *)ptr + 3;
        }
        uVar6 = uVar6 & aVar7.data;
      }
      else {
        p = (byte *)ptr + 2;
      }
      pcVar8 = (char *)((ulong)pcVar8 & uVar6);
    }
    else {
      p = (byte *)ptr + 1;
    }
LAB_002a0108:
    if (p == (byte *)0x0) {
      iVar5 = 4;
    }
    else {
      uVar12 = (uint)pcVar8;
      if (((int)uVar12 < iVar11) || ((int)((uVar3 >> 0x10) + iVar11) <= (int)uVar12)) {
        pcVar8 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
        return pcVar8;
      }
      RepeatedField<unsigned_int>::Add(this,uVar12);
      pVar13._8_8_ = extraout_RDX;
      pVar13.first = (char *)ctx;
      if (p < (ctx->super_EpsCopyInputStream).limit_end_) {
        bVar1 = *p;
        ptr = (char *)(p + 1);
        unaff_R14 = (char *)(ulong)bVar1;
        if ((char)bVar1 < '\0') {
          bVar2 = *ptr;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = extraout_RDX;
          pVar13 = (pair<const_char_*,_unsigned_int>)(auVar4 << 0x40);
          aVar7.data = (ulong)bVar2 << 7;
          uVar12 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          pcVar9 = (char *)(ulong)uVar12;
          if ((char)bVar2 < '\0') {
            pVar13 = ReadTagFallback((char *)p,uVar12);
            ptr = pVar13.first;
            unaff_R14 = (char *)(ulong)pVar13.second;
            pcVar8 = pcVar9;
          }
          else {
            ptr = (char *)(p + 2);
            unaff_R14 = pcVar9;
          }
        }
        ctx_00 = pVar13._8_8_;
        iVar5 = (uint)((byte *)ptr == (byte *)0x0) << 2;
      }
      else {
        iVar5 = 5;
        ctx_00 = extraout_RDX;
      }
    }
    if (iVar5 != 0) {
      if (iVar5 == 4) {
        pcVar8 = Error(msg,pcVar8,ctx_00,(TcFieldData)aVar7,table,hasbits);
        return pcVar8;
      }
      break;
    }
    local_40 = data.field_0._0_4_;
  } while ((int)unaff_R14 == local_40);
  if ((ulong)table->has_bits_offset != 0) {
    puVar10 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar10 & 3) != 0) goto LAB_002a0314;
    *puVar10 = *puVar10 | (uint)hasbits;
  }
  return (char *)p;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}